

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall Minisat::StringOption::reset(StringOption *this)

{
  char *pcVar1;
  string *psVar2;
  long in_RDI;
  allocator local_3d [20];
  allocator local_29;
  string local_28 [40];
  
  if (*(long *)(in_RDI + 0x38) == 0) {
    if (*(long *)(in_RDI + 0x30) != 0) {
      psVar2 = *(string **)(in_RDI + 0x30);
      if (psVar2 != (string *)0x0) {
        std::__cxx11::string::~string(psVar2);
        operator_delete(psVar2);
      }
      *(undefined8 *)(in_RDI + 0x30) = 0;
    }
  }
  else if (*(long *)(in_RDI + 0x30) == 0) {
    psVar2 = (string *)operator_new(0x20);
    pcVar1 = *(char **)(in_RDI + 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(psVar2,pcVar1,local_3d);
    *(string **)(in_RDI + 0x30) = psVar2;
    std::allocator<char>::~allocator((allocator<char> *)local_3d);
  }
  else {
    pcVar1 = *(char **)(in_RDI + 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,pcVar1,&local_29);
    std::__cxx11::string::operator=(*(string **)(in_RDI + 0x30),local_28);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return;
}

Assistant:

virtual void reset()
    {
        if (defaultValue == NULL) {
            if (value != NULL) {
                delete value;
                value = NULL;
            }
        } else {
            if (value != NULL) {
                *value = std::string(defaultValue);
            } else {
                value = new std::string(defaultValue);
            }
        }
    }